

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void sqlite3VdbeMultiLoad(Vdbe *p,int iDest,char *zTypes,...)

{
  char in_AL;
  long lVar1;
  undefined8 in_RCX;
  long in_RDX;
  undefined4 in_ESI;
  undefined8 in_RDI;
  undefined8 in_R8;
  undefined8 in_R9;
  long in_FS_OFFSET;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  char *z;
  char c;
  int i;
  va_list ap;
  int in_stack_fffffffffffffeb8;
  uint in_stack_fffffffffffffebc;
  Vdbe *in_stack_fffffffffffffec0;
  undefined8 in_stack_fffffffffffffec8;
  Vdbe *in_stack_fffffffffffffed0;
  Vdbe *pVVar2;
  undefined1 local_108 [224];
  uint local_28;
  Vdbe *local_20;
  Vdbe *local_18;
  long local_8;
  
  if (in_AL != '\0') {
    local_108._48_8_ = in_XMM0_Qa;
    local_108._64_8_ = in_XMM1_Qa;
    local_108._80_8_ = in_XMM2_Qa;
    local_108._96_8_ = in_XMM3_Qa;
    local_108._112_8_ = in_XMM4_Qa;
    local_108._128_8_ = in_XMM5_Qa;
    local_108._144_8_ = in_XMM6_Qa;
    local_108._160_8_ = in_XMM7_Qa;
  }
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_18 = (Vdbe *)local_108;
  local_20 = (Vdbe *)&stack0x00000008;
  _local_28 = (sqlite3 *)0x3000000018;
  local_108._24_8_ = in_RCX;
  local_108._32_8_ = in_R8;
  local_108._40_8_ = in_R9;
  local_108._200_8_ = in_RDX;
  local_108._212_4_ = in_ESI;
  local_108._216_8_ = in_RDI;
  for (local_108._196_4_ = 0;
      local_108[0xc3] = *(char *)(local_108._200_8_ + (long)(int)local_108._196_4_),
      local_108[0xc3] != '\0'; local_108._196_4_ = local_108._196_4_ + 1) {
    if (local_108[0xc3] == 's') {
      if (local_28 < 0x29) {
        lVar1 = (long)(int)local_28;
        local_28 = local_28 + 8;
        pVVar2 = (Vdbe *)((long)&local_18->db + lVar1);
      }
      else {
        pVVar2 = local_20;
        local_20 = (Vdbe *)&local_20->ppVPrev;
      }
      local_108._184_8_ = pVVar2->db;
      in_stack_fffffffffffffeb8 = 0;
      sqlite3VdbeAddOp4(in_stack_fffffffffffffed0,(int)((ulong)in_stack_fffffffffffffec8 >> 0x20),
                        (int)in_stack_fffffffffffffec8,
                        (int)((ulong)in_stack_fffffffffffffec0 >> 0x20),
                        (int)in_stack_fffffffffffffec0,
                        (char *)((ulong)in_stack_fffffffffffffebc << 0x20),(int)pVVar2);
    }
    else {
      if (local_108[0xc3] != 'i') goto LAB_0021e8bd;
      in_stack_fffffffffffffed0 = (Vdbe *)&stack0xffffffffffffffd8;
      if (local_28 < 0x29) {
        lVar1 = (long)(int)local_28;
        local_28 = local_28 + 8;
        in_stack_fffffffffffffec0 = (Vdbe *)((long)&local_18->db + lVar1);
      }
      else {
        in_stack_fffffffffffffec0 = local_20;
        local_20 = (Vdbe *)&local_20->ppVPrev;
      }
      in_stack_fffffffffffffec8 = local_108._216_8_;
      sqlite3VdbeAddOp2(in_stack_fffffffffffffec0,in_stack_fffffffffffffebc,
                        in_stack_fffffffffffffeb8,0);
    }
  }
  sqlite3VdbeAddOp2(in_stack_fffffffffffffec0,in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8,0)
  ;
LAB_0021e8bd:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

SQLITE_PRIVATE void sqlite3VdbeMultiLoad(Vdbe *p, int iDest, const char *zTypes, ...){
  va_list ap;
  int i;
  char c;
  va_start(ap, zTypes);
  for(i=0; (c = zTypes[i])!=0; i++){
    if( c=='s' ){
      const char *z = va_arg(ap, const char*);
      sqlite3VdbeAddOp4(p, z==0 ? OP_Null : OP_String8, 0, iDest+i, 0, z, 0);
    }else if( c=='i' ){
      sqlite3VdbeAddOp2(p, OP_Integer, va_arg(ap, int), iDest+i);
    }else{
      goto skip_op_resultrow;
    }
  }
  sqlite3VdbeAddOp2(p, OP_ResultRow, iDest, i);
skip_op_resultrow:
  va_end(ap);
}